

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O0

string * xmrig::OclCache::cacheKey_abi_cxx11_(char *deviceKey,char *options,char *source)

{
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  uint8_t result [32];
  uint8_t hash [200];
  string in;
  size_t in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  uint8_t *result_00;
  allocator local_149;
  uint8_t local_148 [263];
  allocator local_41;
  string local_40 [40];
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RCX,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::operator+=(local_40,local_18);
  std::__cxx11::string::operator+=(local_40,local_10);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  keccak(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(uint8_t *)0x20e34a);
  local_148[0x10] = '\0';
  local_148[0x11] = '\0';
  local_148[0x12] = '\0';
  local_148[0x13] = '\0';
  local_148[0x14] = '\0';
  local_148[0x15] = '\0';
  local_148[0x16] = '\0';
  local_148[0x17] = '\0';
  local_148[0x18] = '\0';
  local_148[0x19] = '\0';
  local_148[0x1a] = '\0';
  local_148[0x1b] = '\0';
  local_148[0x1c] = '\0';
  local_148[0x1d] = '\0';
  local_148[0x1e] = '\0';
  local_148[0x1f] = '\0';
  local_148[0] = '\0';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = '\0';
  local_148[5] = '\0';
  local_148[6] = '\0';
  local_148[7] = '\0';
  local_148[8] = '\0';
  local_148[9] = '\0';
  local_148[10] = '\0';
  local_148[0xb] = '\0';
  local_148[0xc] = '\0';
  local_148[0xd] = '\0';
  local_148[0xe] = '\0';
  local_148[0xf] = '\0';
  result_00 = local_148;
  base32_encode(local_148 + 0x20,0xc,result_00,0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,(char *)result_00,&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string xmrig::OclCache::cacheKey(const char *deviceKey, const char *options, const char *source)
{
    std::string in(source);
    in += options;
    in += deviceKey;

    uint8_t hash[200];
    keccak(in.c_str(), in.size(), hash);

    uint8_t result[32] = { 0 };
    base32_encode(hash, 12, result, sizeof(result));

    return reinterpret_cast<char *>(result);
}